

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O3

void __thiscall cnn::RmsPropTrainer::update(RmsPropTrainer *this,real scale)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  long lVar6;
  Parameters *this_00;
  pointer pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  LookupParameters *this_01;
  pointer pTVar11;
  pointer pTVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  int iVar20;
  uint uVar21;
  size_type __new_size;
  Model *pMVar22;
  Index size;
  ulong uVar23;
  _Hash_node_base *p_Var24;
  ulong uVar25;
  undefined8 *puVar26;
  Index index_1;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  RmsPropTrainer *pRVar30;
  Index index_2;
  ulong uVar31;
  int iVar32;
  uint uVar33;
  float fVar34;
  float fVar35;
  scalar_sum_op<float,_float> local_c9;
  RmsPropTrainer *local_c8;
  float local_c0;
  real local_bc;
  ulong local_b8;
  long *local_b0;
  _Hash_node_base *local_a8;
  float local_9c;
  undefined1 local_98 [16];
  float local_88 [2];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  variable_if_dynamic<long,__1> local_70;
  undefined8 *local_60;
  undefined8 *local_58;
  float *local_50;
  ulong local_48;
  
  local_c8 = this;
  local_bc = scale;
  if (this->shadow_params_allocated == false) {
    pMVar22 = (this->super_Trainer).model;
    std::vector<float,_std::allocator<float>_>::resize
              (&this->hg,*(long *)(pMVar22 + 0x20) - *(long *)(pMVar22 + 0x18) >> 3);
    pMVar22 = (this->super_Trainer).model;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&this->hlg,*(long *)(pMVar22 + 0x38) - *(long *)(pMVar22 + 0x30) >> 3);
    pMVar22 = (this->super_Trainer).model;
    puVar26 = *(undefined8 **)(pMVar22 + 0x30);
    puVar5 = *(undefined8 **)(pMVar22 + 0x38);
    if (puVar26 != puVar5) {
      uVar31 = 0;
      do {
        lVar6 = *(long *)&this->hlg;
        __new_size = (**(code **)(*(long *)*puVar26 + 0x18))();
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)(uVar31 * 0x18 + lVar6),__new_size);
        puVar26 = puVar26 + 1;
        uVar31 = (ulong)((int)uVar31 + 1);
      } while (puVar26 != puVar5);
    }
    local_c8->shadow_params_allocated = true;
  }
  local_c0 = Trainer::clip_gradients(&local_c8->super_Trainer);
  pMVar22 = (local_c8->super_Trainer).model;
  p_Var24 = *(_Hash_node_base **)(pMVar22 + 0x18);
  local_a8 = *(_Hash_node_base **)(pMVar22 + 0x20);
  if (p_Var24 != local_a8) {
    uVar31 = 0;
    do {
      this_00 = (Parameters *)p_Var24->_M_nxt;
      uVar23 = (ulong)(this_00->values).d.nd;
      iVar20 = 1;
      iVar32 = 1;
      if (uVar23 != 0) {
        uVar25 = 0;
        do {
          iVar32 = iVar32 * (this_00->values).d.d[uVar25];
          uVar25 = uVar25 + 1;
        } while (uVar23 != uVar25);
      }
      uVar23 = (ulong)(this_00->g).d.nd;
      if (uVar23 != 0) {
        iVar20 = 1;
        uVar25 = 0;
        do {
          iVar20 = iVar20 * (this_00->g).d.d[uVar25];
          uVar25 = uVar25 + 1;
        } while (uVar23 != uVar25);
      }
      pfVar7 = (local_c8->hg).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar33 = iVar32 * (this_00->values).d.bd;
      pfVar8 = (this_00->values).v;
      local_98 = ZEXT416((uint)(local_c8->super_Trainer).lambda);
      uVar21 = iVar20 * (this_00->g).d.bd;
      local_48 = (ulong)uVar21;
      local_50 = (this_00->g).v;
      if (uVar21 == 0) {
        fVar34 = 0.0;
      }
      else {
        uStack_80 = SUB84(local_50,0);
        uStack_7c = (undefined4)((ulong)local_50 >> 0x20);
        local_70.m_value = local_48;
        fVar34 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                             *)local_88,&local_c9,
                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                             *)&local_50);
      }
      fVar34 = (1.0 - local_c8->rho) * fVar34 + pfVar7[uVar31] * local_c8->rho;
      pfVar7[uVar31] = fVar34;
      fVar35 = (local_c8->super_Trainer).eta * local_bc;
      fVar34 = fVar34 + local_c8->epsilon;
      if (fVar34 < 0.0) {
        local_b0 = (long *)CONCAT44(local_b0._4_4_,fVar35);
        fVar34 = sqrtf(fVar34);
        fVar35 = local_b0._0_4_;
      }
      else {
        fVar34 = SQRT(fVar34);
      }
      pfVar9 = (this_00->g).v;
      uVar23 = (ulong)(this_00->g).d.nd;
      iVar20 = 1;
      if (uVar23 != 0) {
        uVar25 = 0;
        do {
          iVar20 = iVar20 * (this_00->g).d.d[uVar25];
          uVar25 = uVar25 + 1;
        } while (uVar23 != uVar25);
      }
      if (iVar20 * (this_00->g).d.bd != uVar33) {
LAB_00221b34:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>]"
                     );
      }
      uVar23 = (ulong)(this_00->values).d.nd;
      iVar20 = 1;
      if (uVar23 != 0) {
        uVar25 = 0;
        do {
          iVar20 = iVar20 * (this_00->values).d.d[uVar25];
          uVar25 = uVar25 + 1;
        } while (uVar23 != uVar25);
      }
      local_88[0] = (fVar35 * local_c0) / fVar34;
      uVar21 = iVar20 * (this_00->values).d.bd;
      uVar23 = (ulong)uVar21;
      pfVar10 = (this_00->values).v;
      uStack_7c = SUB84(pfVar9,0);
      uStack_78 = (undefined4)((ulong)pfVar9 >> 0x20);
      if (uVar21 != uVar33) {
LAB_00221b15:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::sub_assign_op<float, float>]"
                     );
      }
      uVar25 = uVar23;
      if ((((ulong)pfVar10 & 3) == 0) &&
         (uVar25 = (ulong)(-((uint)((ulong)pfVar10 >> 2) & 0x3fffffff) & 3), uVar23 <= uVar25)) {
        uVar25 = uVar23;
      }
      uVar28 = uVar23 - uVar25;
      uVar27 = uVar28 + 3;
      if (-1 < (long)uVar28) {
        uVar27 = uVar28;
      }
      if (uVar25 != 0) {
        uVar29 = 0;
        do {
          pfVar10[uVar29] =
               pfVar10[uVar29] -
               (pfVar8[uVar29] * (float)local_98._0_4_ + pfVar9[uVar29] * local_88[0]);
          uVar29 = uVar29 + 1;
        } while (uVar25 != uVar29);
      }
      uVar27 = (uVar27 & 0xfffffffffffffffc) + uVar25;
      if (3 < (long)uVar28) {
        do {
          pfVar1 = pfVar9 + uVar25;
          fVar34 = pfVar1[1];
          fVar35 = pfVar1[2];
          fVar13 = pfVar1[3];
          pfVar2 = pfVar8 + uVar25;
          fVar14 = pfVar2[1];
          fVar15 = pfVar2[2];
          fVar16 = pfVar2[3];
          pfVar3 = pfVar10 + uVar25;
          fVar17 = pfVar3[1];
          fVar18 = pfVar3[2];
          fVar19 = pfVar3[3];
          pfVar4 = pfVar10 + uVar25;
          *pfVar4 = *pfVar3 - (*pfVar2 * (float)local_98._0_4_ + *pfVar1 * local_88[0]);
          pfVar4[1] = fVar17 - (fVar14 * (float)local_98._0_4_ + fVar34 * local_88[0]);
          pfVar4[2] = fVar18 - (fVar15 * (float)local_98._0_4_ + fVar35 * local_88[0]);
          pfVar4[3] = fVar19 - (fVar16 * (float)local_98._0_4_ + fVar13 * local_88[0]);
          uVar25 = uVar25 + 4;
        } while ((long)uVar25 < (long)uVar27);
      }
      if ((long)uVar27 < (long)uVar23) {
        do {
          pfVar10[uVar27] =
               pfVar10[uVar27] -
               (pfVar8[uVar27] * (float)local_98._0_4_ + pfVar9[uVar27] * local_88[0]);
          uVar27 = uVar27 + 1;
        } while (uVar23 != uVar27);
      }
      uVar31 = (ulong)((int)uVar31 + 1);
      Parameters::clear(this_00);
      p_Var24 = p_Var24 + 1;
    } while (p_Var24 != local_a8);
    pMVar22 = (local_c8->super_Trainer).model;
  }
  local_58 = *(undefined8 **)(pMVar22 + 0x30);
  local_60 = *(undefined8 **)(pMVar22 + 0x38);
  if (local_58 != local_60) {
    local_b8 = 0;
    do {
      this_01 = (LookupParameters *)*local_58;
      p_Var24 = (this_01->non_zero_grads)._M_h._M_before_begin._M_nxt;
      if (p_Var24 != (_Hash_node_base *)0x0) {
        local_b0 = (long *)((local_b8 & 0xffffffff) * 0x18 + *(long *)&local_c8->hlg);
        pRVar30 = local_c8;
        do {
          uVar31 = (ulong)*(uint *)&p_Var24[1]._M_nxt;
          pTVar11 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar23 = (ulong)pTVar11[uVar31].d.nd;
          iVar20 = 1;
          iVar32 = 1;
          if (uVar23 != 0) {
            uVar25 = 0;
            do {
              iVar32 = iVar32 * pTVar11[uVar31].d.d[uVar25];
              uVar25 = uVar25 + 1;
            } while (uVar23 != uVar25);
          }
          pTVar12 = (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar23 = (ulong)pTVar12[uVar31].d.nd;
          if (uVar23 != 0) {
            iVar20 = 1;
            uVar25 = 0;
            do {
              iVar20 = iVar20 * pTVar12[uVar31].d.d[uVar25];
              uVar25 = uVar25 + 1;
            } while (uVar23 != uVar25);
          }
          lVar6 = *local_b0;
          uVar33 = iVar32 * pTVar11[uVar31].d.bd;
          pfVar8 = pTVar11[uVar31].v;
          local_98 = ZEXT416((uint)(pRVar30->super_Trainer).lambda);
          uVar21 = iVar20 * pTVar12[uVar31].d.bd;
          local_48 = (ulong)uVar21;
          local_50 = pTVar12[uVar31].v;
          local_a8 = p_Var24;
          if (uVar21 == 0) {
            fVar34 = 0.0;
          }
          else {
            uStack_80 = SUB84(local_50,0);
            uStack_7c = (undefined4)((ulong)local_50 >> 0x20);
            local_70.m_value = local_48;
            fVar34 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                                 *)local_88,&local_c9,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                                 *)&local_50);
            pRVar30 = local_c8;
          }
          fVar34 = (1.0 - pRVar30->rho) * fVar34 + *(float *)(lVar6 + uVar31 * 4) * pRVar30->rho;
          *(float *)(lVar6 + uVar31 * 4) = fVar34;
          fVar35 = (pRVar30->super_Trainer).eta * local_bc;
          fVar34 = fVar34 + pRVar30->epsilon;
          if (fVar34 < 0.0) {
            local_9c = fVar35;
            fVar34 = sqrtf(fVar34);
            pRVar30 = local_c8;
            fVar35 = local_9c;
          }
          else {
            fVar34 = SQRT(fVar34);
          }
          pTVar11 = (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pfVar9 = pTVar11[uVar31].v;
          uVar23 = (ulong)pTVar11[uVar31].d.nd;
          iVar20 = 1;
          if (uVar23 != 0) {
            uVar25 = 0;
            do {
              iVar20 = iVar20 * pTVar11[uVar31].d.d[uVar25];
              uVar25 = uVar25 + 1;
            } while (uVar23 != uVar25);
          }
          if (iVar20 * pTVar11[uVar31].d.bd != uVar33) goto LAB_00221b34;
          pTVar11 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar23 = (ulong)pTVar11[uVar31].d.nd;
          iVar20 = 1;
          if (uVar23 != 0) {
            uVar25 = 0;
            do {
              iVar20 = iVar20 * pTVar11[uVar31].d.d[uVar25];
              uVar25 = uVar25 + 1;
            } while (uVar23 != uVar25);
          }
          local_88[0] = (fVar35 * local_c0) / fVar34;
          uVar21 = iVar20 * pTVar11[uVar31].d.bd;
          uVar23 = (ulong)uVar21;
          pfVar10 = pTVar11[uVar31].v;
          uStack_7c = SUB84(pfVar9,0);
          uStack_78 = (undefined4)((ulong)pfVar9 >> 0x20);
          if (uVar21 != uVar33) goto LAB_00221b15;
          uVar31 = uVar23;
          if ((((ulong)pfVar10 & 3) == 0) &&
             (uVar31 = (ulong)(-((uint)((ulong)pfVar10 >> 2) & 0x3fffffff) & 3), uVar23 <= uVar31))
          {
            uVar31 = uVar23;
          }
          uVar27 = uVar23 - uVar31;
          uVar25 = uVar27 + 3;
          if (-1 < (long)uVar27) {
            uVar25 = uVar27;
          }
          if (uVar31 != 0) {
            uVar28 = 0;
            do {
              pfVar10[uVar28] =
                   pfVar10[uVar28] -
                   (pfVar8[uVar28] * (float)local_98._0_4_ + pfVar9[uVar28] * local_88[0]);
              uVar28 = uVar28 + 1;
            } while (uVar31 != uVar28);
          }
          uVar25 = (uVar25 & 0xfffffffffffffffc) + uVar31;
          if (3 < (long)uVar27) {
            do {
              pfVar1 = pfVar9 + uVar31;
              fVar34 = pfVar1[1];
              fVar35 = pfVar1[2];
              fVar13 = pfVar1[3];
              pfVar2 = pfVar8 + uVar31;
              fVar14 = pfVar2[1];
              fVar15 = pfVar2[2];
              fVar16 = pfVar2[3];
              pfVar3 = pfVar10 + uVar31;
              fVar17 = pfVar3[1];
              fVar18 = pfVar3[2];
              fVar19 = pfVar3[3];
              pfVar4 = pfVar10 + uVar31;
              *pfVar4 = *pfVar3 - (*pfVar2 * (float)local_98._0_4_ + *pfVar1 * local_88[0]);
              pfVar4[1] = fVar17 - (fVar14 * (float)local_98._0_4_ + fVar34 * local_88[0]);
              pfVar4[2] = fVar18 - (fVar15 * (float)local_98._0_4_ + fVar35 * local_88[0]);
              pfVar4[3] = fVar19 - (fVar16 * (float)local_98._0_4_ + fVar13 * local_88[0]);
              uVar31 = uVar31 + 4;
            } while ((long)uVar31 < (long)uVar25);
          }
          if ((long)uVar25 < (long)uVar23) {
            do {
              pfVar10[uVar25] =
                   pfVar10[uVar25] -
                   (pfVar8[uVar25] * (float)local_98._0_4_ + pfVar9[uVar25] * local_88[0]);
              uVar25 = uVar25 + 1;
            } while (uVar23 != uVar25);
          }
          p_Var24 = local_a8->_M_nxt;
        } while (p_Var24 != (_Hash_node_base *)0x0);
      }
      local_b8 = (ulong)((int)local_b8 + 1);
      LookupParameters::clear(this_01);
      local_58 = local_58 + 1;
    } while (local_58 != local_60);
  }
  (local_c8->super_Trainer).updates = (local_c8->super_Trainer).updates + 1.0;
  return;
}

Assistant:

void RmsPropTrainer::update(real scale) {
  unsigned pi = 0;
  if (!shadow_params_allocated) {
    hg.resize(model->parameters_list().size());

    pi = 0;
    hlg.resize(model->lookup_parameters_list().size());
    for (auto p : model->lookup_parameters_list()) {
      hlg[pi++].resize(p->size());
    }

    shadow_params_allocated = true;
  }

  const float gscale = clip_gradients();
  pi = 0;
  for (auto p : model->parameters_list()) {
    real& d2 = hg[pi++];
    auto reg = p->values.vec() * lambda;
    real g2 = p->g.vec().squaredNorm();
    d2 = rho * d2 + (1.0 - rho) * g2;
    p->values.vec() -= ((eta * scale * gscale / sqrt(d2 + epsilon)) * p->g.vec() + reg);
    p->clear();
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<real>& hlgx = hlg[pi++];
    for (auto i : p->non_zero_grads) {
      real& d2 = hlgx[i];
      auto reg = p->values[i].vec() * lambda;
      real g2 = p->grads[i].vec().squaredNorm();
      d2 = rho * d2 + (1.0 - rho) * g2;
      p->values[i].vec() -= ((eta * scale * gscale / sqrt(d2 + epsilon)) * p->grads[i].vec() + reg);
    }
    p->clear();
  }
  ++updates;
}